

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledCopyPixels.cpp
# Opt level: O3

void anon_unknown.dwarf_304bb5::writeCopyRead
               (string *tempDir,int w,int h,int xs,int ys,int dx,int dy)

{
  ulong *__s;
  ulong *__s_00;
  float fVar1;
  pointer pcVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  _Alloc_hider _Var6;
  _Alloc_hider _Var7;
  bool bVar8;
  bool bVar9;
  char cVar10;
  _Rb_tree_color _Var11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  ostream *poVar21;
  long *plVar22;
  int *piVar23;
  undefined4 *puVar24;
  char *pcVar25;
  half *phVar26;
  Header *pHVar27;
  long lVar28;
  void *pvVar29;
  void *pvVar30;
  undefined8 *puVar31;
  undefined8 *puVar32;
  float *pfVar33;
  float *pfVar34;
  ChannelList *pCVar35;
  ChannelList *pCVar36;
  ulong uVar37;
  ulong *puVar38;
  long lVar39;
  ulong *puVar40;
  ulong *puVar41;
  undefined4 uVar42;
  uint uVar43;
  undefined4 in_register_0000000c;
  int iVar44;
  void *pvVar45;
  ulong uVar46;
  void *pvVar47;
  ulong uVar48;
  undefined4 in_register_00000084;
  ulong uVar49;
  undefined4 in_register_0000008c;
  uint uVar50;
  long lVar51;
  Array2D<Imath_3_2::half> *pAVar52;
  long lVar53;
  Array2D<Imath_3_2::half> *pAVar54;
  long lVar55;
  long lVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  int iVar69;
  long local_288;
  long local_280;
  Array2D<Imath_3_2::half> *local_278;
  TiledInputFile in1;
  ulong *local_260;
  TiledInputFile in2;
  FrameBuffer fb;
  ulong *local_208;
  FrameBuffer fb2;
  Array2D<Imath_3_2::half> ph1;
  TiledOutputFile out;
  string filename2;
  string filename1;
  Array<Imf_3_2::Array2D<Imath_3_2::half>_> levels2;
  Array<Imf_3_2::Array2D<Imath_3_2::half>_> levels1;
  Header hdr;
  
  filename1._M_dataplus._M_p = (pointer)&filename1.field_2;
  pcVar2 = (tempDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&filename1,pcVar2,pcVar2 + tempDir->_M_string_length,
             CONCAT44(in_register_0000000c,xs),CONCAT44(in_register_00000084,ys),
             CONCAT44(in_register_0000008c,dx));
  std::__cxx11::string::append((char *)&filename1);
  filename2._M_dataplus._M_p = (pointer)&filename2.field_2;
  pcVar2 = (tempDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&filename2,pcVar2,pcVar2 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)&filename2);
  _Var11 = w + 0xaa;
  iVar44 = h + 0x102;
  lVar19 = (long)-h;
  lVar20 = (long)-w;
  iVar18 = 0;
  do {
    iVar17 = 0;
    bVar8 = true;
    do {
      bVar9 = bVar8;
      _Var7._M_p = filename1._M_dataplus._M_p;
      _Var6._M_p = filename2._M_dataplus._M_p;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"levelMode 0, ",0xd);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"compression ",0xc);
      poVar21 = (ostream *)std::ostream::operator<<(&std::cout,iVar18);
      std::__ostream_insert<char,std::char_traits<char>>(poVar21,", roundingMode ",0xf);
      poVar21 = (ostream *)std::ostream::operator<<(poVar21,iVar17);
      std::__ostream_insert<char,std::char_traits<char>>(poVar21,", xOffset ",10);
      poVar21 = (ostream *)std::ostream::operator<<(poVar21,w);
      std::__ostream_insert<char,std::char_traits<char>>(poVar21,", yOffset ",10);
      plVar22 = (long *)std::ostream::operator<<(poVar21,h);
      std::ios::widen((char)*(undefined8 *)(*plVar22 + -0x18) + (char)plVar22);
      std::ostream::put((char)plVar22);
      std::ostream::flush();
      _out = 0;
      fb2._map._M_t._M_impl._0_8_ = 0;
      fb._map._M_t._M_impl._0_4_ = w;
      fb._map._M_t._M_impl._4_4_ = h;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _Var11;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = iVar44;
      Imf_3_2::Header::Header
                (&hdr,(Box *)&out,(Box *)&fb,1.0,(Vec2 *)&fb2,1.0,INCREASING_Y,ZIP_COMPRESSION);
      piVar23 = (int *)Imf_3_2::Header::compression();
      *piVar23 = iVar18;
      puVar24 = (undefined4 *)Imf_3_2::Header::lineOrder();
      *puVar24 = 0;
      pcVar25 = (char *)Imf_3_2::Header::channels();
      Imf_3_2::Channel::Channel((Channel *)&out,HALF,1,1,false);
      Imf_3_2::ChannelList::insert(pcVar25,(Channel *)0x1ca214);
      _out = 0x3700000011;
      Imf_3_2::Header::setTileDescription((TileDescription *)&hdr);
      ph1._sizeX = 0x103;
      ph1._sizeY = 0xab;
      phVar26 = (half *)operator_new__(0x15a02);
      ph1._data = phVar26;
      fillPixels(&ph1,0xab,0x103);
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_3_2::Slice::Slice
                ((Slice *)&out,HALF,(char *)(phVar26 + lVar19 * 0xab + lVar20),2,0x156,1,1,0.0,false
                 ,false);
      Imf_3_2::FrameBuffer::insert((char *)&fb,(Slice *)0x1ca214);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," writing",8);
      std::ostream::flush();
      remove(_Var7._M_p);
      iVar12 = Imf_3_2::globalThreadCount();
      Imf_3_2::TiledOutputFile::TiledOutputFile(&out,_Var7._M_p,&hdr,iVar12);
      Imf_3_2::TiledOutputFile::setFrameBuffer((FrameBuffer *)&out);
      iVar14 = (int)&out;
      iVar12 = Imf_3_2::TiledOutputFile::numXTiles(iVar14);
      iVar13 = Imf_3_2::TiledOutputFile::numYTiles(iVar14);
      Imf_3_2::TiledOutputFile::writeTiles(iVar14,0,iVar12 + -1,0,iVar13 + -1);
      Imf_3_2::TiledOutputFile::~TiledOutputFile(&out);
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                   *)&fb);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," copying",8);
      std::ostream::flush();
      remove(_Var6._M_p);
      iVar12 = Imf_3_2::globalThreadCount();
      Imf_3_2::InputFile::InputFile((InputFile *)&fb,_Var7._M_p,iVar12);
      pHVar27 = (Header *)Imf_3_2::InputFile::header();
      iVar12 = Imf_3_2::globalThreadCount();
      Imf_3_2::TiledOutputFile::TiledOutputFile(&out,_Var6._M_p,pHVar27,iVar12);
      Imf_3_2::TiledOutputFile::copyPixels((InputFile *)&out);
      Imf_3_2::TiledOutputFile::~TiledOutputFile(&out);
      Imf_3_2::InputFile::~InputFile((InputFile *)&fb);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," reading",8);
      std::ostream::flush();
      iVar12 = Imf_3_2::globalThreadCount();
      Imf_3_2::TiledInputFile::TiledInputFile(&in1,_Var7._M_p,iVar12);
      iVar12 = Imf_3_2::globalThreadCount();
      Imf_3_2::TiledInputFile::TiledInputFile(&in2,_Var6._M_p,iVar12);
      Imf_3_2::TiledInputFile::header();
      piVar23 = (int *)Imf_3_2::Header::dataWindow();
      iVar12 = piVar23[2];
      lVar53 = (long)*piVar23;
      uVar37 = (iVar12 - lVar53) + 1;
      iVar13 = piVar23[1];
      iVar14 = piVar23[3] - iVar13;
      uVar50 = iVar14 + 1;
      lVar28 = (long)(int)uVar50 * uVar37;
      uVar46 = lVar28 * 2;
      if (lVar28 < 0) {
        uVar46 = 0xffffffffffffffff;
      }
      pvVar29 = operator_new__(uVar46);
      pvVar30 = operator_new__(uVar46);
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb2._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb2._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      lVar28 = (long)-iVar13 * uVar37;
      uVar46 = uVar37 * 2;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_3_2::Slice::Slice
                ((Slice *)&out,HALF,(char *)((long)pvVar29 + lVar53 * -2 + lVar28 * 2),2,uVar46,1,1,
                 0.0,false,false);
      Imf_3_2::FrameBuffer::insert((char *)&fb,(Slice *)0x1ca214);
      Imf_3_2::Slice::Slice
                ((Slice *)&out,HALF,(char *)((long)pvVar30 + lVar53 * -2 + lVar28 * 2),2,uVar46,1,1,
                 0.0,false,false);
      Imf_3_2::FrameBuffer::insert((char *)&fb2,(Slice *)0x1ca214);
      Imf_3_2::TiledInputFile::setFrameBuffer((FrameBuffer *)&in1);
      iVar13 = Imf_3_2::TiledInputFile::numXTiles((int)&in1);
      iVar15 = Imf_3_2::TiledInputFile::numYTiles((int)&in1);
      Imf_3_2::TiledInputFile::readTiles((int)&in1,0,iVar13 + -1,0,iVar15 + -1);
      Imf_3_2::TiledInputFile::setFrameBuffer((FrameBuffer *)&in2);
      iVar13 = Imf_3_2::TiledInputFile::numXTiles((int)&in2);
      iVar15 = Imf_3_2::TiledInputFile::numYTiles((int)&in2);
      uVar42 = 0;
      Imf_3_2::TiledInputFile::readTiles((int)&in2,0,iVar13 + -1,0,iVar15 + -1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," comparing",10);
      std::ostream::flush();
      Imf_3_2::TiledInputFile::header();
      puVar31 = (undefined8 *)Imf_3_2::Header::displayWindow();
      puVar32 = (undefined8 *)Imf_3_2::Header::displayWindow();
      iVar13 = -(uint)((int)*puVar32 == (int)*puVar31);
      iVar15 = -(uint)((int)((ulong)*puVar32 >> 0x20) == (int)((ulong)*puVar31 >> 0x20));
      auVar57._4_4_ = iVar13;
      auVar57._0_4_ = iVar13;
      auVar57._8_4_ = iVar15;
      auVar57._12_4_ = iVar15;
      iVar13 = movmskpd(uVar42,auVar57);
      if ((iVar13 != 3) ||
         (iVar15 = -(uint)((int)puVar32[1] == (int)puVar31[1]),
         iVar69 = -(uint)((int)((ulong)puVar32[1] >> 0x20) == (int)((ulong)puVar31[1] >> 0x20)),
         auVar58._4_4_ = iVar15, auVar58._0_4_ = iVar15, auVar58._8_4_ = iVar69,
         auVar58._12_4_ = iVar69, iVar15 = movmskpd((int)puVar32,auVar58), iVar15 != 3)) {
        __assert_fail("in2.header ().displayWindow () == hdr.displayWindow ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x8d,
                      "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_2::TiledInputFile::header();
      puVar31 = (undefined8 *)Imf_3_2::Header::dataWindow();
      puVar32 = (undefined8 *)Imf_3_2::Header::dataWindow();
      iVar15 = -(uint)((int)*puVar32 == (int)*puVar31);
      iVar69 = -(uint)((int)((ulong)*puVar32 >> 0x20) == (int)((ulong)*puVar31 >> 0x20));
      auVar59._4_4_ = iVar15;
      auVar59._0_4_ = iVar15;
      auVar59._8_4_ = iVar69;
      auVar59._12_4_ = iVar69;
      iVar13 = movmskpd(iVar13,auVar59);
      if ((iVar13 != 3) ||
         (iVar13 = -(uint)((int)puVar32[1] == (int)puVar31[1]),
         iVar15 = -(uint)((int)((ulong)puVar32[1] >> 0x20) == (int)((ulong)puVar31[1] >> 0x20)),
         auVar60._4_4_ = iVar13, auVar60._0_4_ = iVar13, auVar60._8_4_ = iVar15,
         auVar60._12_4_ = iVar15, iVar13 = movmskpd((int)puVar32,auVar60), iVar13 != 3)) {
        __assert_fail("in2.header ().dataWindow () == hdr.dataWindow ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x8e,
                      "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_2::TiledInputFile::header();
      pfVar33 = (float *)Imf_3_2::Header::pixelAspectRatio();
      fVar1 = *pfVar33;
      pfVar33 = (float *)Imf_3_2::Header::pixelAspectRatio();
      if ((fVar1 != *pfVar33) || (NAN(fVar1) || NAN(*pfVar33))) {
        __assert_fail("in2.header ().pixelAspectRatio () == hdr.pixelAspectRatio ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x8f,
                      "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_2::TiledInputFile::header();
      pfVar33 = (float *)Imf_3_2::Header::screenWindowCenter();
      pfVar34 = (float *)Imf_3_2::Header::screenWindowCenter();
      if ((((*pfVar33 != *pfVar34) || (NAN(*pfVar33) || NAN(*pfVar34))) ||
          (pfVar33[1] != pfVar34[1])) || (NAN(pfVar33[1]) || NAN(pfVar34[1]))) {
        __assert_fail("in2.header ().screenWindowCenter () == hdr.screenWindowCenter ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x91,
                      "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_2::TiledInputFile::header();
      pfVar33 = (float *)Imf_3_2::Header::screenWindowWidth();
      fVar1 = *pfVar33;
      pfVar33 = (float *)Imf_3_2::Header::screenWindowWidth();
      if ((fVar1 != *pfVar33) || (NAN(fVar1) || NAN(*pfVar33))) {
        __assert_fail("in2.header ().screenWindowWidth () == hdr.screenWindowWidth ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x92,
                      "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_2::TiledInputFile::header();
      piVar23 = (int *)Imf_3_2::Header::lineOrder();
      iVar13 = *piVar23;
      piVar23 = (int *)Imf_3_2::Header::lineOrder();
      if (iVar13 != *piVar23) {
        __assert_fail("in2.header ().lineOrder () == hdr.lineOrder ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x93,
                      "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_2::TiledInputFile::header();
      piVar23 = (int *)Imf_3_2::Header::compression();
      iVar13 = *piVar23;
      piVar23 = (int *)Imf_3_2::Header::compression();
      if (iVar13 != *piVar23) {
        __assert_fail("in2.header ().compression () == hdr.compression ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x94,
                      "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_2::TiledInputFile::header();
      pCVar35 = (ChannelList *)Imf_3_2::Header::channels();
      pCVar36 = (ChannelList *)Imf_3_2::Header::channels();
      cVar10 = Imf_3_2::ChannelList::operator==(pCVar35,pCVar36);
      if (cVar10 == '\0') {
        __assert_fail("in2.header ().channels () == hdr.channels ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x95,
                      "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      if (-1 < iVar14) {
        uVar48 = 0;
        pvVar45 = pvVar29;
        pvVar47 = pvVar30;
        do {
          if (-1 < (int)(iVar12 - lVar53)) {
            uVar49 = 0;
            do {
              fVar1 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)((long)pvVar45 + uVar49 * 2) * 4);
              pfVar33 = (float *)(_imath_half_to_float_table +
                                 (ulong)*(ushort *)((long)pvVar47 + uVar49 * 2) * 4);
              if ((fVar1 != *pfVar33) || (NAN(fVar1) || NAN(*pfVar33))) {
                __assert_fail("ph1[y][x] == ph2[y][x]",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                              ,0x99,
                              "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                             );
              }
              uVar49 = uVar49 + 1;
            } while ((uVar37 & 0xffffffff) != uVar49);
          }
          uVar48 = uVar48 + 1;
          pvVar47 = (void *)((long)pvVar47 + uVar46);
          pvVar45 = (void *)((long)pvVar45 + uVar46);
        } while (uVar48 != uVar50);
      }
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                   *)&fb2);
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                   *)&fb);
      operator_delete__(pvVar30);
      operator_delete__(pvVar29);
      Imf_3_2::TiledInputFile::~TiledInputFile(&in2);
      Imf_3_2::TiledInputFile::~TiledInputFile(&in1);
      remove(_Var7._M_p);
      remove(_Var6._M_p);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
      std::ostream::put('X');
      std::ostream::flush();
      operator_delete__(phVar26);
      Imf_3_2::Header::~Header(&hdr);
      _Var7 = filename1._M_dataplus;
      _Var6 = filename2._M_dataplus;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"levelMode 1, ",0xd);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"compression ",0xc);
      poVar21 = (ostream *)std::ostream::operator<<(&std::cout,iVar18);
      std::__ostream_insert<char,std::char_traits<char>>(poVar21,", roundingMode ",0xf);
      poVar21 = (ostream *)std::ostream::operator<<(poVar21,iVar17);
      std::__ostream_insert<char,std::char_traits<char>>(poVar21,", xOffset ",10);
      poVar21 = (ostream *)std::ostream::operator<<(poVar21,w);
      std::__ostream_insert<char,std::char_traits<char>>(poVar21,", yOffset ",10);
      plVar22 = (long *)std::ostream::operator<<(poVar21,h);
      std::ios::widen((char)*(undefined8 *)(*plVar22 + -0x18) + (char)plVar22);
      std::ostream::put((char)plVar22);
      std::ostream::flush();
      _out = 0;
      fb2._map._M_t._M_impl._0_8_ = 0;
      fb._map._M_t._M_impl._0_4_ = w;
      fb._map._M_t._M_impl._4_4_ = h;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _Var11;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = iVar44;
      Imf_3_2::Header::Header
                (&hdr,(Box *)&out,(Box *)&fb,1.0,(Vec2 *)&fb2,1.0,INCREASING_Y,ZIP_COMPRESSION);
      piVar23 = (int *)Imf_3_2::Header::compression();
      *piVar23 = iVar18;
      puVar24 = (undefined4 *)Imf_3_2::Header::lineOrder();
      *puVar24 = 0;
      pcVar25 = (char *)Imf_3_2::Header::channels();
      Imf_3_2::Channel::Channel((Channel *)&out,HALF,1,1,false);
      Imf_3_2::ChannelList::insert(pcVar25,(Channel *)0x1ca214);
      _out = 0x3700000011;
      Imf_3_2::Header::setTileDescription((TileDescription *)&hdr);
      ph1._sizeX = 0;
      ph1._sizeY = 0;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," writing",8);
      std::ostream::flush();
      remove(_Var7._M_p);
      iVar12 = Imf_3_2::globalThreadCount();
      Imf_3_2::TiledOutputFile::TiledOutputFile((TiledOutputFile *)&fb2,_Var7._M_p,&hdr,iVar12);
      iVar12 = Imf_3_2::TiledOutputFile::numLevels();
      uVar46 = (ulong)iVar12;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar46;
      uVar37 = SUB168(auVar3 * ZEXT816(0x18),0);
      uVar48 = uVar37 + 8;
      if (0xfffffffffffffff7 < uVar37) {
        uVar48 = 0xffffffffffffffff;
      }
      if (SUB168(auVar3 * ZEXT816(0x18),8) != 0) {
        uVar48 = 0xffffffffffffffff;
      }
      puVar38 = (ulong *)operator_new__(uVar48);
      *puVar38 = uVar46;
      if (iVar12 != 0) {
        memset(puVar38 + 1,0,((uVar37 - 0x18) / 0x18) * 0x18 + 0x18);
      }
      if (ph1._sizeY != 0) {
        lVar28 = *(long *)(ph1._sizeY + -8);
        pvVar29 = (void *)(ph1._sizeY + -8);
        if (lVar28 != 0) {
          lVar53 = lVar28 * 0x18;
          do {
            pvVar30 = *(void **)((long)pvVar29 + lVar53);
            if (pvVar30 != (void *)0x0) {
              operator_delete__(pvVar30);
            }
            lVar53 = lVar53 + -0x18;
          } while (lVar53 != 0);
        }
        operator_delete__(pvVar29,lVar28 * 0x18 + 8);
      }
      lVar28 = 0;
      lVar53 = 0;
      ph1._sizeX = uVar46;
      ph1._sizeY = (long)(puVar38 + 1);
      while( true ) {
        iVar12 = Imf_3_2::TiledOutputFile::numLevels();
        if (iVar12 <= lVar53) break;
        iVar12 = Imf_3_2::TiledOutputFile::levelWidth((int)&fb2);
        iVar13 = Imf_3_2::TiledOutputFile::levelHeight((int)&fb2);
        lVar56 = ph1._sizeY;
        lVar51 = (long)iVar12;
        lVar39 = iVar13 * lVar51;
        uVar37 = lVar39 * 2;
        if (lVar39 < 0) {
          uVar37 = 0xffffffffffffffff;
        }
        pvVar30 = operator_new__(uVar37);
        pvVar29 = *(void **)(lVar56 + 0x10 + lVar28);
        lVar39 = lVar56;
        if (pvVar29 != (void *)0x0) {
          operator_delete__(pvVar29);
          lVar39 = ph1._sizeY;
        }
        *(long *)(lVar56 + lVar28) = (long)iVar13;
        *(long *)(lVar56 + 8 + lVar28) = lVar51;
        *(void **)(lVar56 + 0x10 + lVar28) = pvVar30;
        fillPixels((Array2D<Imath_3_2::half> *)(lVar39 + lVar28),iVar12,iVar13);
        fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
        fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        Imf_3_2::Slice::Slice
                  ((Slice *)&out,HALF,
                   (char *)(*(long *)(ph1._sizeY + 8 + lVar28) * lVar19 * 2 +
                            *(long *)(ph1._sizeY + 0x10 + lVar28) + lVar20 * 2),2,lVar51 * 2,1,1,0.0
                   ,false,false);
        Imf_3_2::FrameBuffer::insert((char *)&fb,(Slice *)0x1ca214);
        Imf_3_2::TiledOutputFile::setFrameBuffer(&fb2);
        iVar14 = (int)&fb2;
        iVar12 = Imf_3_2::TiledOutputFile::numXTiles(iVar14);
        iVar13 = Imf_3_2::TiledOutputFile::numYTiles(iVar14);
        Imf_3_2::TiledOutputFile::writeTiles(iVar14,0,iVar12 + -1,0,iVar13 + -1);
        std::
        _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
        ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                     *)&fb);
        lVar53 = lVar53 + 1;
        lVar28 = lVar28 + 0x18;
      }
      Imf_3_2::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&fb2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," copying",8);
      std::ostream::flush();
      remove(_Var6._M_p);
      iVar12 = Imf_3_2::globalThreadCount();
      Imf_3_2::InputFile::InputFile((InputFile *)&fb,_Var7._M_p,iVar12);
      pHVar27 = (Header *)Imf_3_2::InputFile::header();
      iVar12 = Imf_3_2::globalThreadCount();
      Imf_3_2::TiledOutputFile::TiledOutputFile(&out,_Var6._M_p,pHVar27,iVar12);
      Imf_3_2::TiledOutputFile::copyPixels((InputFile *)&out);
      Imf_3_2::TiledOutputFile::~TiledOutputFile(&out);
      Imf_3_2::InputFile::~InputFile((InputFile *)&fb);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," reading",8);
      std::ostream::flush();
      iVar12 = Imf_3_2::globalThreadCount();
      Imf_3_2::TiledInputFile::TiledInputFile(&in1,_Var7._M_p,iVar12);
      iVar12 = Imf_3_2::globalThreadCount();
      Imf_3_2::TiledInputFile::TiledInputFile(&in2,_Var6._M_p,iVar12);
      Imf_3_2::TiledInputFile::header();
      piVar23 = (int *)Imf_3_2::Header::dataWindow();
      iVar12 = *piVar23;
      iVar13 = piVar23[1];
      uVar16 = Imf_3_2::TiledInputFile::numLevels();
      Imf_3_2::Array<Imf_3_2::Array2D<Imath_3_2::half>_>::Array(&levels1,(long)(int)uVar16);
      Imf_3_2::Array<Imf_3_2::Array2D<Imath_3_2::half>_>::Array(&levels2,(long)(int)uVar16);
      uVar50 = uVar16;
      if (0 < (int)uVar16) {
        lVar28 = 0x10;
        uVar37 = 0;
        do {
          iVar14 = Imf_3_2::TiledInputFile::levelWidth((int)&in2);
          iVar15 = Imf_3_2::TiledInputFile::levelHeight((int)&in2);
          pAVar54 = levels1._data;
          lVar56 = (long)iVar15;
          lVar53 = (long)iVar14;
          uVar46 = lVar56 * lVar53 * 2;
          if (lVar56 * lVar53 < 0) {
            uVar46 = 0xffffffffffffffff;
          }
          pvVar30 = operator_new__(uVar46);
          pvVar29 = *(void **)((long)&pAVar54->_sizeX + lVar28);
          if (pvVar29 != (void *)0x0) {
            operator_delete__(pvVar29);
          }
          pAVar52 = levels2._data;
          *(long *)((long)pAVar54 + lVar28 + -0x10) = lVar56;
          *(long *)((long)pAVar54 + lVar28 + -8) = lVar53;
          *(void **)((long)&pAVar54->_sizeX + lVar28) = pvVar30;
          pvVar30 = operator_new__(uVar46);
          pvVar29 = *(void **)((long)&pAVar52->_sizeX + lVar28);
          if (pvVar29 != (void *)0x0) {
            operator_delete__(pvVar29);
          }
          *(long *)((long)pAVar52 + lVar28 + -0x10) = lVar56;
          *(long *)((long)pAVar52 + lVar28 + -8) = lVar53;
          *(void **)((long)&pAVar52->_sizeX + lVar28) = pvVar30;
          fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
          fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &fb2._map._M_t._M_impl.super__Rb_tree_header._M_header;
          fb2._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          Imf_3_2::Slice::Slice
                    ((Slice *)&out,HALF,
                     (char *)(*(long *)((long)levels1._data + lVar28 + -8) * -(long)iVar13 * 2 +
                              *(long *)((long)&(levels1._data)->_sizeX + lVar28) + (long)iVar12 * -2
                             ),2,lVar53 * 2,1,1,0.0,false,false);
          Imf_3_2::FrameBuffer::insert((char *)&fb,(Slice *)0x1ca214);
          Imf_3_2::Slice::Slice
                    ((Slice *)&out,HALF,
                     (char *)(*(long *)((long)levels2._data + lVar28 + -8) * -(long)iVar13 * 2 +
                              *(long *)((long)&(levels2._data)->_sizeX + lVar28) + (long)iVar12 * -2
                             ),2,lVar53 * 2,1,1,0.0,false,false);
          Imf_3_2::FrameBuffer::insert((char *)&fb2,(Slice *)0x1ca214);
          Imf_3_2::TiledInputFile::setFrameBuffer((FrameBuffer *)&in1);
          Imf_3_2::TiledInputFile::setFrameBuffer((FrameBuffer *)&in2);
          iVar14 = Imf_3_2::TiledInputFile::numXTiles((int)&in1);
          iVar15 = Imf_3_2::TiledInputFile::numYTiles((int)&in1);
          Imf_3_2::TiledInputFile::readTiles((int)&in1,0,iVar14 + -1,0,iVar15 + -1);
          iVar14 = Imf_3_2::TiledInputFile::numXTiles((int)&in2);
          iVar15 = Imf_3_2::TiledInputFile::numYTiles((int)&in2);
          uVar50 = 0;
          Imf_3_2::TiledInputFile::readTiles((int)&in2,0,iVar14 + -1,0,iVar15 + -1);
          std::
          _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
          ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                       *)&fb2);
          std::
          _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
          ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                       *)&fb);
          uVar37 = uVar37 + 1;
          lVar28 = lVar28 + 0x18;
        } while (uVar16 != uVar37);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," comparing",10);
      std::ostream::flush();
      Imf_3_2::TiledInputFile::header();
      puVar31 = (undefined8 *)Imf_3_2::Header::displayWindow();
      puVar32 = (undefined8 *)Imf_3_2::Header::displayWindow();
      iVar12 = -(uint)((int)*puVar32 == (int)*puVar31);
      iVar13 = -(uint)((int)((ulong)*puVar32 >> 0x20) == (int)((ulong)*puVar31 >> 0x20));
      auVar61._4_4_ = iVar12;
      auVar61._0_4_ = iVar12;
      auVar61._8_4_ = iVar13;
      auVar61._12_4_ = iVar13;
      iVar12 = movmskpd(uVar50,auVar61);
      if ((iVar12 != 3) ||
         (iVar13 = -(uint)((int)puVar32[1] == (int)puVar31[1]),
         iVar14 = -(uint)((int)((ulong)puVar32[1] >> 0x20) == (int)((ulong)puVar31[1] >> 0x20)),
         auVar62._4_4_ = iVar13, auVar62._0_4_ = iVar13, auVar62._8_4_ = iVar14,
         auVar62._12_4_ = iVar14, iVar13 = movmskpd((int)puVar32,auVar62), iVar13 != 3)) {
        __assert_fail("in2.header ().displayWindow () == hdr.displayWindow ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,300,
                      "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_2::TiledInputFile::header();
      puVar31 = (undefined8 *)Imf_3_2::Header::dataWindow();
      puVar32 = (undefined8 *)Imf_3_2::Header::dataWindow();
      iVar13 = -(uint)((int)*puVar32 == (int)*puVar31);
      iVar14 = -(uint)((int)((ulong)*puVar32 >> 0x20) == (int)((ulong)*puVar31 >> 0x20));
      auVar63._4_4_ = iVar13;
      auVar63._0_4_ = iVar13;
      auVar63._8_4_ = iVar14;
      auVar63._12_4_ = iVar14;
      iVar12 = movmskpd(iVar12,auVar63);
      if ((iVar12 != 3) ||
         (iVar12 = -(uint)((int)puVar32[1] == (int)puVar31[1]),
         iVar13 = -(uint)((int)((ulong)puVar32[1] >> 0x20) == (int)((ulong)puVar31[1] >> 0x20)),
         auVar64._4_4_ = iVar12, auVar64._0_4_ = iVar12, auVar64._8_4_ = iVar13,
         auVar64._12_4_ = iVar13, iVar12 = movmskpd((int)puVar32,auVar64), iVar12 != 3)) {
        __assert_fail("in2.header ().dataWindow () == hdr.dataWindow ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x12d,
                      "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_2::TiledInputFile::header();
      pfVar33 = (float *)Imf_3_2::Header::pixelAspectRatio();
      fVar1 = *pfVar33;
      pfVar33 = (float *)Imf_3_2::Header::pixelAspectRatio();
      if ((fVar1 != *pfVar33) || (NAN(fVar1) || NAN(*pfVar33))) {
        __assert_fail("in2.header ().pixelAspectRatio () == hdr.pixelAspectRatio ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x12e,
                      "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_2::TiledInputFile::header();
      pfVar33 = (float *)Imf_3_2::Header::screenWindowCenter();
      pfVar34 = (float *)Imf_3_2::Header::screenWindowCenter();
      if ((((*pfVar33 != *pfVar34) || (NAN(*pfVar33) || NAN(*pfVar34))) ||
          (pfVar33[1] != pfVar34[1])) || (NAN(pfVar33[1]) || NAN(pfVar34[1]))) {
        __assert_fail("in2.header ().screenWindowCenter () == hdr.screenWindowCenter ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x130,
                      "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_2::TiledInputFile::header();
      pfVar33 = (float *)Imf_3_2::Header::screenWindowWidth();
      fVar1 = *pfVar33;
      pfVar33 = (float *)Imf_3_2::Header::screenWindowWidth();
      if ((fVar1 != *pfVar33) || (NAN(fVar1) || NAN(*pfVar33))) {
        __assert_fail("in2.header ().screenWindowWidth () == hdr.screenWindowWidth ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x131,
                      "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_2::TiledInputFile::header();
      piVar23 = (int *)Imf_3_2::Header::lineOrder();
      iVar12 = *piVar23;
      piVar23 = (int *)Imf_3_2::Header::lineOrder();
      if (iVar12 != *piVar23) {
        __assert_fail("in2.header ().lineOrder () == hdr.lineOrder ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x132,
                      "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_2::TiledInputFile::header();
      piVar23 = (int *)Imf_3_2::Header::compression();
      iVar12 = *piVar23;
      piVar23 = (int *)Imf_3_2::Header::compression();
      if (iVar12 != *piVar23) {
        __assert_fail("in2.header ().compression () == hdr.compression ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x133,
                      "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_2::TiledInputFile::header();
      pCVar35 = (ChannelList *)Imf_3_2::Header::channels();
      pCVar36 = (ChannelList *)Imf_3_2::Header::channels();
      cVar10 = Imf_3_2::ChannelList::operator==(pCVar35,pCVar36);
      if (cVar10 == '\0') {
        __assert_fail("in2.header ().channels () == hdr.channels ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x134,
                      "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      if (0 < (int)uVar16) {
        uVar37 = 0;
        do {
          lVar53 = 0;
          lVar28 = 0;
          while( true ) {
            iVar12 = Imf_3_2::TiledInputFile::levelHeight((int)&in1);
            if (iVar12 <= lVar28) break;
            lVar56 = 0;
            while( true ) {
              iVar12 = Imf_3_2::TiledInputFile::levelWidth((int)&in1);
              if (iVar12 <= lVar56) break;
              fVar1 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(uint16_t *)
                                        ((long)&levels2._data[uVar37]._data[lVar56]._h +
                                        levels2._data[uVar37]._sizeY * lVar53) * 4);
              pfVar33 = (float *)(_imath_half_to_float_table +
                                 (ulong)*(uint16_t *)
                                         ((long)&levels1._data[uVar37]._data[lVar56]._h +
                                         levels1._data[uVar37]._sizeY * lVar53) * 4);
              if ((fVar1 != *pfVar33) || (NAN(fVar1) || NAN(*pfVar33))) {
                __assert_fail("(levels2[l])[y][x] == (levels1[l])[y][x]",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                              ,0x13a,
                              "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                             );
              }
              if ((iVar18 - 8U < 0xfffffffe) &&
                 ((pfVar33 = (float *)(_imath_half_to_float_table +
                                      (ulong)*(ushort *)
                                              (*(long *)(ph1._sizeY + 8 + uVar37 * 0x18) * lVar53 +
                                               *(long *)(ph1._sizeY + 0x10 + uVar37 * 0x18) +
                                              lVar56 * 2) * 4), fVar1 != *pfVar33 ||
                  (NAN(fVar1) || NAN(*pfVar33))))) {
                __assert_fail("(levels2[l])[y][x] == (levels[l])[y][x]",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                              ,0x13d,
                              "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                             );
              }
              lVar56 = lVar56 + 1;
            }
            lVar28 = lVar28 + 1;
            lVar53 = lVar53 + 2;
          }
          uVar37 = uVar37 + 1;
        } while (uVar37 != uVar16);
      }
      Imf_3_2::Array<Imf_3_2::Array2D<Imath_3_2::half>_>::~Array(&levels2);
      Imf_3_2::Array<Imf_3_2::Array2D<Imath_3_2::half>_>::~Array(&levels1);
      Imf_3_2::TiledInputFile::~TiledInputFile(&in2);
      Imf_3_2::TiledInputFile::~TiledInputFile(&in1);
      remove(_Var7._M_p);
      remove(_Var6._M_p);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
      std::ostream::put('X');
      std::ostream::flush();
      Imf_3_2::Array<Imf_3_2::Array2D<Imath_3_2::half>_>::~Array
                ((Array<Imf_3_2::Array2D<Imath_3_2::half>_> *)&ph1);
      Imf_3_2::Header::~Header(&hdr);
      _Var7 = filename1._M_dataplus;
      _Var6 = filename2._M_dataplus;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"levelMode 2, ",0xd);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"compression ",0xc);
      poVar21 = (ostream *)std::ostream::operator<<(&std::cout,iVar18);
      std::__ostream_insert<char,std::char_traits<char>>(poVar21,", roundingMode ",0xf);
      poVar21 = (ostream *)std::ostream::operator<<(poVar21,iVar17);
      std::__ostream_insert<char,std::char_traits<char>>(poVar21,", xOffset ",10);
      poVar21 = (ostream *)std::ostream::operator<<(poVar21,w);
      std::__ostream_insert<char,std::char_traits<char>>(poVar21,", yOffset ",10);
      plVar22 = (long *)std::ostream::operator<<(poVar21,h);
      std::ios::widen((char)*(undefined8 *)(*plVar22 + -0x18) + (char)plVar22);
      std::ostream::put((char)plVar22);
      std::ostream::flush();
      _out = 0;
      fb2._map._M_t._M_impl._0_8_ = 0;
      fb._map._M_t._M_impl._0_4_ = w;
      fb._map._M_t._M_impl._4_4_ = h;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _Var11;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = iVar44;
      Imf_3_2::Header::Header
                (&hdr,(Box *)&out,(Box *)&fb,1.0,(Vec2 *)&fb2,1.0,INCREASING_Y,ZIP_COMPRESSION);
      piVar23 = (int *)Imf_3_2::Header::compression();
      *piVar23 = iVar18;
      puVar24 = (undefined4 *)Imf_3_2::Header::lineOrder();
      *puVar24 = 0;
      pcVar25 = (char *)Imf_3_2::Header::channels();
      Imf_3_2::Channel::Channel((Channel *)&out,HALF,1,1,false);
      Imf_3_2::ChannelList::insert(pcVar25,(Channel *)0x1ca214);
      _out = 0x3700000011;
      Imf_3_2::Header::setTileDescription((TileDescription *)&hdr);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," writing",8);
      std::ostream::flush();
      remove(_Var7._M_p);
      iVar17 = Imf_3_2::globalThreadCount();
      Imf_3_2::TiledOutputFile::TiledOutputFile((TiledOutputFile *)&fb2,_Var7._M_p,&hdr,iVar17);
      iVar17 = Imf_3_2::TiledOutputFile::numYLevels();
      iVar12 = Imf_3_2::TiledOutputFile::numXLevels();
      lVar28 = (long)iVar12;
      uVar46 = iVar17 * lVar28;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar46;
      uVar37 = SUB168(auVar4 * ZEXT816(0x18),0);
      uVar48 = uVar37 + 8;
      if (0xfffffffffffffff7 < uVar37) {
        uVar48 = 0xffffffffffffffff;
      }
      if (SUB168(auVar4 * ZEXT816(0x18),8) != 0) {
        uVar48 = 0xffffffffffffffff;
      }
      puVar38 = (ulong *)operator_new__(uVar48);
      *puVar38 = uVar46;
      pAVar54 = (Array2D<Imath_3_2::half> *)(puVar38 + 1);
      if (uVar46 != 0) {
        memset(pAVar54,0,((uVar37 - 0x18) / 0x18) * 0x18 + 0x18);
      }
      local_288 = 0;
      local_278 = pAVar54;
      while( true ) {
        iVar17 = Imf_3_2::TiledOutputFile::numYLevels();
        if (iVar17 <= local_288) break;
        lVar53 = 0;
        pAVar52 = local_278;
        while( true ) {
          iVar17 = Imf_3_2::TiledOutputFile::numXLevels();
          if (iVar17 <= lVar53) break;
          iVar17 = Imf_3_2::TiledOutputFile::levelWidth((int)&fb2);
          iVar12 = Imf_3_2::TiledOutputFile::levelHeight((int)&fb2);
          lVar39 = (long)iVar17;
          lVar56 = iVar12 * lVar39;
          uVar37 = lVar56 * 2;
          if (lVar56 < 0) {
            uVar37 = 0xffffffffffffffff;
          }
          phVar26 = (half *)operator_new__(uVar37);
          if (pAVar52->_data != (half *)0x0) {
            operator_delete__(pAVar52->_data);
          }
          pAVar52->_sizeX = (long)iVar12;
          pAVar52->_sizeY = lVar39;
          pAVar52->_data = phVar26;
          fillPixels(pAVar52,iVar17,iVar12);
          fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
          fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          Imf_3_2::Slice::Slice
                    ((Slice *)&out,HALF,(char *)(pAVar52->_data + pAVar52->_sizeY * lVar19 + lVar20)
                     ,2,lVar39 * 2,1,1,0.0,false,false);
          Imf_3_2::FrameBuffer::insert((char *)&fb,(Slice *)0x1ca214);
          Imf_3_2::TiledOutputFile::setFrameBuffer(&fb2);
          iVar13 = (int)&fb2;
          iVar17 = Imf_3_2::TiledOutputFile::numXTiles(iVar13);
          iVar12 = Imf_3_2::TiledOutputFile::numYTiles(iVar13);
          Imf_3_2::TiledOutputFile::writeTiles(iVar13,0,iVar17 + -1,0,iVar12 + -1,(int)lVar53);
          std::
          _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
          ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                       *)&fb);
          lVar53 = lVar53 + 1;
          pAVar52 = pAVar52 + 1;
        }
        local_288 = local_288 + 1;
        local_278 = local_278 + lVar28;
      }
      Imf_3_2::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&fb2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," copying",8);
      std::ostream::flush();
      remove(_Var6._M_p);
      iVar17 = Imf_3_2::globalThreadCount();
      Imf_3_2::InputFile::InputFile((InputFile *)&fb,_Var7._M_p,iVar17);
      pHVar27 = (Header *)Imf_3_2::InputFile::header();
      iVar17 = Imf_3_2::globalThreadCount();
      Imf_3_2::TiledOutputFile::TiledOutputFile(&out,_Var6._M_p,pHVar27,iVar17);
      Imf_3_2::TiledOutputFile::copyPixels((InputFile *)&out);
      Imf_3_2::TiledOutputFile::~TiledOutputFile(&out);
      Imf_3_2::InputFile::~InputFile((InputFile *)&fb);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," reading",8);
      std::ostream::flush();
      iVar17 = Imf_3_2::globalThreadCount();
      Imf_3_2::TiledInputFile::TiledInputFile((TiledInputFile *)&ph1,_Var7._M_p,iVar17);
      iVar17 = Imf_3_2::globalThreadCount();
      Imf_3_2::TiledInputFile::TiledInputFile(&in1,_Var6._M_p,iVar17);
      Imf_3_2::TiledInputFile::header();
      piVar23 = (int *)Imf_3_2::Header::dataWindow();
      iVar17 = *piVar23;
      iVar12 = piVar23[1];
      uVar50 = Imf_3_2::TiledInputFile::numXLevels();
      uVar16 = Imf_3_2::TiledInputFile::numYLevels();
      lVar53 = (long)(int)uVar50;
      uVar46 = (int)uVar16 * lVar53;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar46;
      uVar37 = SUB168(auVar5 * ZEXT816(0x18),0);
      uVar48 = uVar37 + 8;
      if (0xfffffffffffffff7 < uVar37) {
        uVar48 = 0xffffffffffffffff;
      }
      if (SUB168(auVar5 * ZEXT816(0x18),8) != 0) {
        uVar48 = 0xffffffffffffffff;
      }
      puVar40 = (ulong *)operator_new__(uVar48);
      *puVar40 = uVar46;
      __s = puVar40 + 1;
      if (uVar46 != 0) {
        memset(__s,0,((uVar37 - 0x18) / 0x18) * 0x18 + 0x18);
      }
      puVar41 = (ulong *)operator_new__(uVar48);
      __s_00 = puVar41 + 1;
      *puVar41 = uVar46;
      if (uVar46 != 0) {
        memset(__s_00,0,((uVar37 - 0x18) / 0x18) * 0x18 + 0x18);
      }
      uVar37 = (ulong)uVar16;
      uVar43 = uVar16;
      if (0 < (int)uVar16) {
        local_260 = puVar41 + 3;
        local_208 = puVar40 + 3;
        uVar48 = 0;
        uVar46 = uVar37;
        do {
          if (0 < (int)uVar50) {
            local_280 = 0;
            uVar49 = 0;
            do {
              iVar13 = Imf_3_2::TiledInputFile::levelWidth((int)&in1);
              iVar14 = Imf_3_2::TiledInputFile::levelHeight((int)&in1);
              lVar39 = (long)iVar14;
              lVar56 = (long)iVar13;
              uVar46 = lVar39 * lVar56 * 2;
              if (lVar39 * lVar56 < 0) {
                uVar46 = 0xffffffffffffffff;
              }
              pvVar29 = operator_new__(uVar46);
              if (*(void **)((long)local_208 + local_280) != (void *)0x0) {
                operator_delete__(*(void **)((long)local_208 + local_280));
              }
              *(long *)((long)local_208 + local_280 + -0x10) = lVar39;
              *(long *)((long)local_208 + local_280 + -8) = lVar56;
              *(void **)((long)local_208 + local_280) = pvVar29;
              pvVar30 = operator_new__(uVar46);
              lVar51 = lVar56;
              if (*(void **)((long)local_260 + local_280) != (void *)0x0) {
                operator_delete__(*(void **)((long)local_260 + local_280));
                lVar51 = *(long *)((long)local_208 + local_280 + -8);
                pvVar29 = *(void **)((long)local_208 + local_280);
              }
              *(long *)((long)local_260 + local_280 + -0x10) = lVar39;
              *(long *)((long)local_260 + local_280 + -8) = lVar56;
              *(void **)((long)local_260 + local_280) = pvVar30;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &fb2._map._M_t._M_impl.super__Rb_tree_header._M_header;
              fb2._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              Imf_3_2::Slice::Slice
                        ((Slice *)&out,HALF,
                         (char *)((long)pvVar29 + (long)iVar17 * -2 + lVar51 * -(long)iVar12 * 2),2,
                         lVar56 * 2,1,1,0.0,false,false);
              Imf_3_2::FrameBuffer::insert((char *)&fb,(Slice *)0x1ca214);
              Imf_3_2::Slice::Slice
                        ((Slice *)&out,HALF,
                         (char *)(*(long *)((long)local_260 + local_280 + -8) * -(long)iVar12 * 2 +
                                  *(long *)((long)local_260 + local_280) + (long)iVar17 * -2),2,
                         lVar56 * 2,1,1,0.0,false,false);
              Imf_3_2::FrameBuffer::insert((char *)&fb2,(Slice *)0x1ca214);
              Imf_3_2::TiledInputFile::setFrameBuffer((FrameBuffer *)&ph1);
              Imf_3_2::TiledInputFile::setFrameBuffer((FrameBuffer *)&in1);
              iVar13 = Imf_3_2::TiledInputFile::numXTiles((int)&ph1);
              iVar14 = Imf_3_2::TiledInputFile::numYTiles((int)&ph1);
              Imf_3_2::TiledInputFile::readTiles((int)&ph1,0,iVar13 + -1,0,iVar14 + -1,(int)uVar49);
              iVar13 = Imf_3_2::TiledInputFile::numXTiles((int)&in1);
              iVar14 = Imf_3_2::TiledInputFile::numYTiles((int)&in1);
              uVar46 = 0;
              Imf_3_2::TiledInputFile::readTiles((int)&in1,0,iVar13 + -1,0,iVar14 + -1,(int)uVar49);
              std::
              _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
              ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                           *)&fb2);
              std::
              _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
              ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                           *)&fb);
              uVar49 = uVar49 + 1;
              local_280 = local_280 + 0x18;
            } while (uVar50 != uVar49);
          }
          uVar43 = (uint)uVar46;
          uVar48 = uVar48 + 1;
          local_260 = local_260 + lVar53 * 3;
          local_208 = local_208 + lVar53 * 3;
        } while (uVar48 != uVar37);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," comparing",10);
      std::ostream::flush();
      Imf_3_2::TiledInputFile::header();
      puVar31 = (undefined8 *)Imf_3_2::Header::displayWindow();
      puVar32 = (undefined8 *)Imf_3_2::Header::displayWindow();
      iVar17 = -(uint)((int)*puVar32 == (int)*puVar31);
      iVar12 = -(uint)((int)((ulong)*puVar32 >> 0x20) == (int)((ulong)*puVar31 >> 0x20));
      auVar65._4_4_ = iVar17;
      auVar65._0_4_ = iVar17;
      auVar65._8_4_ = iVar12;
      auVar65._12_4_ = iVar12;
      iVar17 = movmskpd(uVar43,auVar65);
      if ((iVar17 != 3) ||
         (iVar12 = -(uint)((int)puVar32[1] == (int)puVar31[1]),
         iVar13 = -(uint)((int)((ulong)puVar32[1] >> 0x20) == (int)((ulong)puVar31[1] >> 0x20)),
         auVar66._4_4_ = iVar12, auVar66._0_4_ = iVar12, auVar66._8_4_ = iVar13,
         auVar66._12_4_ = iVar13, iVar12 = movmskpd((int)puVar32,auVar66), iVar12 != 3)) {
        __assert_fail("in2.header ().displayWindow () == hdr.displayWindow ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x1da,
                      "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_2::TiledInputFile::header();
      puVar31 = (undefined8 *)Imf_3_2::Header::dataWindow();
      puVar32 = (undefined8 *)Imf_3_2::Header::dataWindow();
      iVar12 = -(uint)((int)*puVar32 == (int)*puVar31);
      iVar13 = -(uint)((int)((ulong)*puVar32 >> 0x20) == (int)((ulong)*puVar31 >> 0x20));
      auVar67._4_4_ = iVar12;
      auVar67._0_4_ = iVar12;
      auVar67._8_4_ = iVar13;
      auVar67._12_4_ = iVar13;
      iVar17 = movmskpd(iVar17,auVar67);
      if ((iVar17 != 3) ||
         (iVar17 = -(uint)((int)puVar32[1] == (int)puVar31[1]),
         iVar12 = -(uint)((int)((ulong)puVar32[1] >> 0x20) == (int)((ulong)puVar31[1] >> 0x20)),
         auVar68._4_4_ = iVar17, auVar68._0_4_ = iVar17, auVar68._8_4_ = iVar12,
         auVar68._12_4_ = iVar12, iVar17 = movmskpd((int)puVar32,auVar68), iVar17 != 3)) {
        __assert_fail("in2.header ().dataWindow () == hdr.dataWindow ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x1db,
                      "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_2::TiledInputFile::header();
      pfVar33 = (float *)Imf_3_2::Header::pixelAspectRatio();
      fVar1 = *pfVar33;
      pfVar33 = (float *)Imf_3_2::Header::pixelAspectRatio();
      if ((fVar1 != *pfVar33) || (NAN(fVar1) || NAN(*pfVar33))) {
        __assert_fail("in2.header ().pixelAspectRatio () == hdr.pixelAspectRatio ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x1dc,
                      "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_2::TiledInputFile::header();
      pfVar33 = (float *)Imf_3_2::Header::screenWindowCenter();
      pfVar34 = (float *)Imf_3_2::Header::screenWindowCenter();
      if ((((*pfVar33 != *pfVar34) || (NAN(*pfVar33) || NAN(*pfVar34))) ||
          (pfVar33[1] != pfVar34[1])) || (NAN(pfVar33[1]) || NAN(pfVar34[1]))) {
        __assert_fail("in2.header ().screenWindowCenter () == hdr.screenWindowCenter ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x1de,
                      "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_2::TiledInputFile::header();
      pfVar33 = (float *)Imf_3_2::Header::screenWindowWidth();
      fVar1 = *pfVar33;
      pfVar33 = (float *)Imf_3_2::Header::screenWindowWidth();
      if ((fVar1 != *pfVar33) || (NAN(fVar1) || NAN(*pfVar33))) {
        __assert_fail("in2.header ().screenWindowWidth () == hdr.screenWindowWidth ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x1df,
                      "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_2::TiledInputFile::header();
      piVar23 = (int *)Imf_3_2::Header::lineOrder();
      iVar17 = *piVar23;
      piVar23 = (int *)Imf_3_2::Header::lineOrder();
      if (iVar17 != *piVar23) {
        __assert_fail("in2.header ().lineOrder () == hdr.lineOrder ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x1e0,
                      "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_2::TiledInputFile::header();
      piVar23 = (int *)Imf_3_2::Header::compression();
      iVar17 = *piVar23;
      piVar23 = (int *)Imf_3_2::Header::compression();
      if (iVar17 != *piVar23) {
        __assert_fail("in2.header ().compression () == hdr.compression ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x1e1,
                      "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_2::TiledInputFile::header();
      pCVar35 = (ChannelList *)Imf_3_2::Header::channels();
      pCVar36 = (ChannelList *)Imf_3_2::Header::channels();
      cVar10 = Imf_3_2::ChannelList::operator==(pCVar35,pCVar36);
      if (cVar10 == '\0') {
        __assert_fail("in2.header ().channels () == hdr.channels ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x1e2,
                      "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      if (0 < (int)uVar16) {
        local_260 = (ulong *)0x0;
        do {
          if (0 < (int)uVar50) {
            lVar56 = (long)local_260 * lVar53;
            uVar46 = 0;
            do {
              lVar39 = 0;
              lVar51 = 0;
              while( true ) {
                iVar17 = Imf_3_2::TiledInputFile::levelHeight((int)&ph1);
                if (iVar17 <= lVar51) break;
                lVar55 = 0;
                while( true ) {
                  iVar17 = Imf_3_2::TiledInputFile::levelWidth((int)&ph1);
                  if (iVar17 <= lVar55) break;
                  fVar1 = *(float *)(_imath_half_to_float_table +
                                    (ulong)*(ushort *)
                                            (__s_00[lVar56 * 3 + uVar46 * 3 + 1] * lVar39 +
                                             __s_00[lVar56 * 3 + uVar46 * 3 + 2] + lVar55 * 2) * 4);
                  pfVar33 = (float *)(_imath_half_to_float_table +
                                     (ulong)*(ushort *)
                                             (__s[lVar56 * 3 + uVar46 * 3 + 1] * lVar39 +
                                              __s[lVar56 * 3 + uVar46 * 3 + 2] + lVar55 * 2) * 4);
                  if ((fVar1 != *pfVar33) || (NAN(fVar1) || NAN(*pfVar33))) {
                    __assert_fail("(levels2[ly][lx])[y][x] == (levels1[ly][lx])[y][x]",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                                  ,0x1ea,
                                  "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                                 );
                  }
                  if ((iVar18 - 8U < 0xfffffffe) &&
                     ((pfVar33 = (float *)(_imath_half_to_float_table +
                                          (ulong)*(uint16_t *)
                                                  ((long)&pAVar54[(long)local_260 * lVar28 + uVar46]
                                                          ._data[lVar55]._h +
                                                  pAVar54[(long)local_260 * lVar28 + uVar46]._sizeY
                                                  * lVar39) * 4), fVar1 != *pfVar33 ||
                      (NAN(fVar1) || NAN(*pfVar33))))) {
                    __assert_fail("(levels2[ly][lx])[y][x] == (levels[ly][lx])[y][x]",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                                  ,0x1ef,
                                  "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                                 );
                  }
                  lVar55 = lVar55 + 1;
                }
                lVar51 = lVar51 + 1;
                lVar39 = lVar39 + 2;
              }
              uVar46 = uVar46 + 1;
            } while (uVar46 != uVar50);
          }
          local_260 = (ulong *)((long)local_260 + 1);
        } while (local_260 != (ulong *)uVar37);
      }
      if (__s_00 != (ulong *)0x0) {
        if (*puVar41 == 0) {
          uVar37 = 8;
        }
        else {
          lVar28 = *puVar41 * 0x18;
          lVar53 = lVar28;
          do {
            if (*(void **)((long)puVar41 + lVar53) != (void *)0x0) {
              operator_delete__(*(void **)((long)puVar41 + lVar53));
            }
            lVar53 = lVar53 + -0x18;
          } while (lVar53 != 0);
          uVar37 = lVar28 + 8;
        }
        operator_delete__(puVar41,uVar37);
      }
      if (__s != (ulong *)0x0) {
        if (*puVar40 == 0) {
          uVar37 = 8;
        }
        else {
          lVar28 = *puVar40 * 0x18;
          lVar53 = lVar28;
          do {
            if (*(void **)((long)puVar40 + lVar53) != (void *)0x0) {
              operator_delete__(*(void **)((long)puVar40 + lVar53));
            }
            lVar53 = lVar53 + -0x18;
          } while (lVar53 != 0);
          uVar37 = lVar28 + 8;
        }
        operator_delete__(puVar40,uVar37);
      }
      Imf_3_2::TiledInputFile::~TiledInputFile(&in1);
      Imf_3_2::TiledInputFile::~TiledInputFile((TiledInputFile *)&ph1);
      remove(_Var7._M_p);
      remove(_Var6._M_p);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
      std::ostream::put('X');
      std::ostream::flush();
      if (pAVar54 != (Array2D<Imath_3_2::half> *)0x0) {
        if (*puVar38 == 0) {
          uVar37 = 8;
        }
        else {
          lVar28 = *puVar38 * 0x18;
          lVar53 = lVar28;
          do {
            if (*(void **)((long)puVar38 + lVar53) != (void *)0x0) {
              operator_delete__(*(void **)((long)puVar38 + lVar53));
            }
            lVar53 = lVar53 + -0x18;
          } while (lVar53 != 0);
          uVar37 = lVar28 + 8;
        }
        operator_delete__(puVar38,uVar37);
      }
      Imf_3_2::Header::~Header(&hdr);
      iVar17 = 1;
      bVar8 = false;
    } while (bVar9);
    iVar18 = iVar18 + 1;
    if (iVar18 == 10) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)filename2._M_dataplus._M_p != &filename2.field_2) {
        operator_delete(filename2._M_dataplus._M_p,filename2.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)filename1._M_dataplus._M_p != &filename1.field_2) {
        operator_delete(filename1._M_dataplus._M_p,filename1.field_2._M_allocated_capacity + 1);
      }
      return;
    }
  } while( true );
}

Assistant:

void
writeCopyRead (
    const std::string& tempDir, int w, int h, int xs, int ys, int dx, int dy)
{
    std::string filename1 = tempDir + "imf_test_copy1.exr";
    std::string filename2 = tempDir + "imf_test_copy2.exr";

    for (int comp = 0; comp < NUM_COMPRESSION_METHODS; ++comp)
    {
        for (int rmode = 0; rmode < NUM_ROUNDINGMODES; ++rmode)
        {
            writeCopyReadONE (
                filename1.c_str (),
                filename2.c_str (),
                w,
                h,
                xs,
                ys,
                dx,
                dy,
                Compression (comp),
                LevelRoundingMode (rmode));

            writeCopyReadMIP (
                filename1.c_str (),
                filename2.c_str (),
                w,
                h,
                xs,
                ys,
                dx,
                dy,
                Compression (comp),
                LevelRoundingMode (rmode));

            writeCopyReadRIP (
                filename1.c_str (),
                filename2.c_str (),
                w,
                h,
                xs,
                ys,
                dx,
                dy,
                Compression (comp),
                LevelRoundingMode (rmode));
        }
    }
}